

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,vector<long,_std::allocator<long>_> *target,
          string_view name,string_view value)

{
  string_view *psVar1;
  long lVar2;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> sVar3;
  optional<long> oVar4;
  string_view sVar5;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> splitMem;
  _Storage<long,_true> local_78;
  undefined1 local_70;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_68;
  
  local_68.data_ = (pointer)local_68.firstElement;
  local_68.len = 0;
  local_68.cap = 2;
  sVar5._M_str._0_4_ = ((this->flags).m_bits & 2) >> 1;
  sVar5._M_len = (size_t)value._M_str;
  sVar5._M_str._4_4_ = 0;
  sVar3 = parseList((slang *)value._M_len,sVar5,SUB81(&local_68,0),
                    (SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)
                    name._M_str);
  psVar1 = sVar3._M_ptr;
  for (lVar2 = sVar3._M_extent._M_extent_value._M_extent_value << 4; lVar2 != 0;
      lVar2 = lVar2 + -0x10) {
    sVar5 = *psVar1;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    value._M_str = (char *)name._M_str;
    oVar4 = parseInt<long>(name,sVar5,__return_storage_ptr__);
    local_78._M_value =
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_70 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_engaged;
    if (((undefined1  [16])
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_001b479d;
    value._M_str = (char *)&local_78;
    std::vector<long,_std::allocator<long>_>::push_back(target,(value_type_conflict3 *)value._M_str)
    ;
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    psVar1 = psVar1 + 1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_001b479d:
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::cleanup
            (&local_68,(EVP_PKEY_CTX *)value._M_str);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::vector<int64_t>& target, std::string_view name,
                                     std::string_view value) {
    return setIntList(target, name, value, flags);
}